

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

bool death_prog_trophy_belt(OBJ_DATA *belt,CHAR_DATA *ch)

{
  OBJ_DATA *obj;
  undefined8 in_RSI;
  int vnum;
  TROPHY_DATA *in_RDI;
  OBJ_DATA *unaff_retaddr;
  OBJ_DATA *newbelt;
  bool in_stack_00000023;
  int in_stack_00000024;
  OBJ_DATA *in_stack_00000028;
  CHAR_DATA *in_stack_00000030;
  int in_stack_0000008c;
  OBJ_INDEX_DATA *in_stack_00000090;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  vnum = (int)((ulong)in_RSI >> 0x20);
  if (*(int *)((long)&in_RDI[0x12].next + 4) != 0) {
    extract_obj(unaff_retaddr);
    get_obj_index(vnum);
    obj = create_object(in_stack_00000090,in_stack_0000008c);
    obj_to_char(obj,in_stack_ffffffffffffffd8);
    equip_char(in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000023);
    free_trophy(in_RDI);
    obj->value[4] = 0;
  }
  return false;
}

Assistant:

bool death_prog_trophy_belt(OBJ_DATA *belt, CHAR_DATA *ch)
{
	OBJ_DATA *newbelt;

	if (!belt->value[4])
		return false;

	extract_obj(belt);

	newbelt = create_object(get_obj_index(23645), 0);
	obj_to_char(newbelt, ch);
	equip_char(ch, newbelt, WEAR_WAIST, false);

	free_trophy(ch->pcdata->trophy);

	newbelt->value[4] = 0;
	return false;
}